

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# warped_motion.c
# Opt level: O2

void av1_warp_plane(WarpedMotionParams *wm,int use_hbd,int bd,uint8_t *ref,int width,int height,
                   int stride,uint8_t *pred,int p_col,int p_row,int p_width,int p_height,
                   int p_stride,int subsampling_x,int subsampling_y,ConvolveParams *conv_params)

{
  if (use_hbd == 0) {
    warp_plane(wm,ref,width,height,stride,pred,p_col,p_row,p_width,p_height,p_stride,subsampling_x,
               subsampling_y,conv_params);
  }
  else {
    highbd_warp_plane(wm,(uint16_t *)((long)ref * 2),width,height,stride,
                      (uint16_t *)((long)pred * 2),p_col,p_row,p_width,p_height,p_stride,
                      subsampling_x,subsampling_y,bd,conv_params);
  }
  return;
}

Assistant:

void av1_warp_plane(WarpedMotionParams *wm, int use_hbd, int bd,
                    const uint8_t *ref, int width, int height, int stride,
                    uint8_t *pred, int p_col, int p_row, int p_width,
                    int p_height, int p_stride, int subsampling_x,
                    int subsampling_y, ConvolveParams *conv_params) {
#if CONFIG_AV1_HIGHBITDEPTH
  if (use_hbd)
    highbd_warp_plane(wm, CONVERT_TO_SHORTPTR(ref), width, height, stride,
                      CONVERT_TO_SHORTPTR(pred), p_col, p_row, p_width,
                      p_height, p_stride, subsampling_x, subsampling_y, bd,
                      conv_params);
  else
    warp_plane(wm, ref, width, height, stride, pred, p_col, p_row, p_width,
               p_height, p_stride, subsampling_x, subsampling_y, conv_params);
#else
  (void)use_hbd;
  (void)bd;
  warp_plane(wm, ref, width, height, stride, pred, p_col, p_row, p_width,
             p_height, p_stride, subsampling_x, subsampling_y, conv_params);
#endif
}